

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeBufferReader::ByteCodeBufferReader
          (ByteCodeBufferReader *this,ScriptContext *scriptContext,byte *raw,bool isLibraryCode,
          int builtInPropertyCount)

{
  undefined3 in_register_00000009;
  
  this->scriptContext = scriptContext;
  this->raw = raw;
  this->magic = 0;
  this->totalSize = 0;
  this->fileVersionScheme = '\0';
  this->V1 = 0;
  this->V2 = 0;
  this->V3 = 0;
  this->V4 = 0;
  this->architecture = '\0';
  this->expectedFunctionBodySize = 0x1e8;
  this->expectedBuildInPropertyCount = builtInPropertyCount;
  this->expectedOpCodeCount = 0x4b3;
  this->firstFunctionId = 0;
  this->functionCount = 0;
  *(undefined8 *)&this->scopeInfoCount = 0;
  *(undefined8 *)((long)&this->string16s + 4) = 0;
  this->string16IndexTable = (StringIndexRecord *)0x0;
  this->string16Table = (byte *)0x0;
  this->lineInfoCacheCount = 0;
  this->lineInfoCaches = (byte *)0x0;
  this->lineCharacterOffsetCacheBuffer = (charcount_t *)0x0;
  this->lineByteOffsetCacheBuffer = (charcount_t *)0x0;
  this->functions = (byte *)0x0;
  this->sourceIndex = 0;
  this->scopeInfoTable = (byte *)0x0;
  this->scopeInfoRelativeOffsets = (byte *)0x0;
  this->sourceSize = 0;
  this->sourceCharLength = 0;
  this->utf8SourceInfo = (Utf8SourceInfo *)0x0;
  this->isLibraryCode = isLibraryCode;
  if (CONCAT31(in_register_00000009,isLibraryCode) != 0) {
    this->expectedFunctionBodySize = 0;
    this->expectedOpCodeCount = 0;
  }
  return;
}

Assistant:

ByteCodeBufferReader(ScriptContext * scriptContext, byte * raw, bool isLibraryCode, int builtInPropertyCount)
        : scriptContext(scriptContext),
        raw(raw),
        magic(0),
        totalSize(0),
        fileVersionScheme(0),
        V1(0),
        V2(0),
        V3(0),
        V4(0),
        architecture(0),
        expectedFunctionBodySize(sizeof(unaligned FunctionBody)),
        expectedBuildInPropertyCount(builtInPropertyCount),
        expectedOpCodeCount((int)OpCode::Count),
        firstFunctionId(0),
        functionCount(0),
        scopeInfoCount(0),
        string16s(nullptr),
        string16Count(0),
        string16IndexTable(nullptr),
        string16Table(nullptr),
        lineInfoCacheCount(0),
        lineInfoCaches(nullptr),
        lineCharacterOffsetCacheBuffer(nullptr),
        lineByteOffsetCacheBuffer(nullptr),
        functions(nullptr),
        scopeInfoTable(nullptr),
        scopeInfoRelativeOffsets(nullptr),
        sourceSize(0),
        sourceCharLength(0),
        utf8SourceInfo(nullptr),
        sourceIndex(0),
        isLibraryCode(isLibraryCode)
    {
        if (isLibraryCode)
        {
            expectedFunctionBodySize = 0;
            expectedOpCodeCount = 0;
        }
    }